

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_Byte * tt_cmap14_find_variant(FT_Byte *base,FT_UInt32 variantCode)

{
  bool bVar1;
  FT_Byte *in_RAX;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar2 = *(uint *)base;
  uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar3 = 0;
  do {
    if (uVar2 <= uVar3) {
      return (FT_Byte *)0x0;
    }
    uVar4 = uVar3 + uVar2 >> 1;
    uVar5 = (ulong)(uVar4 * 0xb);
    uVar6 = (uint)base[uVar5 + 6] | (uint)base[uVar5 + 5] << 8 | (uint)base[uVar5 + 4] << 0x10;
    bVar1 = true;
    if (uVar6 <= variantCode) {
      if (uVar6 < variantCode) {
        uVar3 = uVar4 + 1;
        uVar4 = uVar2;
      }
      else {
        in_RAX = base + uVar5 + 7;
        bVar1 = false;
        uVar4 = uVar2;
      }
    }
    uVar2 = uVar4;
  } while (bVar1);
  return in_RAX;
}

Assistant:

static FT_Byte*
  tt_cmap14_find_variant( FT_Byte    *base,
                          FT_UInt32   variantCode )
  {
    FT_UInt32  numVar = TT_PEEK_ULONG( base );
    FT_UInt32  max, min;


    min = 0;
    max = numVar;

    base += 4;

    /* binary search */
    while ( min < max )
    {
      FT_UInt32  mid    = ( min + max ) >> 1;
      FT_Byte*   p      = base + 11 * mid;
      FT_ULong   varSel = TT_NEXT_UINT24( p );


      if ( variantCode < varSel )
        max = mid;
      else if ( variantCode > varSel )
        min = mid + 1;
      else
        return p;
    }

    return NULL;
  }